

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

size_t coda_strispn(char *s,char *n)

{
  char cVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  char cVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  
  cVar5 = *s;
  pcVar7 = s;
  if (cVar5 != '\0') {
    cVar1 = *n;
    pcVar6 = s;
    while (pcVar7 = s, cVar1 != '\0') {
      pp_Var2 = __ctype_tolower_loc();
      pcVar3 = n + 1;
      cVar4 = cVar1;
      while ((*pp_Var2)[cVar5] != (*pp_Var2)[cVar4]) {
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        pcVar7 = pcVar6;
        if (cVar4 == '\0') goto LAB_001053d5;
      }
      cVar5 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
      pcVar7 = pcVar6;
      if (cVar5 == '\0') break;
    }
  }
LAB_001053d5:
  return (long)pcVar7 - (long)s;
}

Assistant:

size_t coda_strispn(const char *s, const char *n)
{
	const char *p = s;
	const char *x;

	for (; *p; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}